

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O1

bool binlog::operator==(EventSource *a,EventSource *b)

{
  size_t sVar1;
  __type _Var2;
  int iVar3;
  
  if (((a->id == b->id) && (a->severity == b->severity)) &&
     (sVar1 = (a->category)._M_string_length, sVar1 == (b->category)._M_string_length)) {
    if ((sVar1 != 0) &&
       (iVar3 = bcmp((a->category)._M_dataplus._M_p,(b->category)._M_dataplus._M_p,sVar1),
       iVar3 != 0)) {
      return false;
    }
    sVar1 = (a->function)._M_string_length;
    if (sVar1 == (b->function)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar3 = bcmp((a->function)._M_dataplus._M_p,(b->function)._M_dataplus._M_p,sVar1),
         iVar3 != 0)) {
        return false;
      }
      sVar1 = (a->file)._M_string_length;
      if (sVar1 == (b->file)._M_string_length) {
        if ((sVar1 != 0) &&
           (iVar3 = bcmp((a->file)._M_dataplus._M_p,(b->file)._M_dataplus._M_p,sVar1), iVar3 != 0))
        {
          return false;
        }
        if ((a->line == b->line) &&
           (_Var2 = std::operator==(&a->formatString,&b->formatString), _Var2)) {
          _Var2 = std::operator==(&a->argumentTags,&b->argumentTags);
          return _Var2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const EventSource& a, const EventSource& b)
{
  return a.id == b.id
    &&   a.severity == b.severity
    &&   a.category == b.category
    &&   a.function == b.function
    &&   a.file == b.file
    &&   a.line == b.line
    &&   a.formatString == b.formatString
    &&   a.argumentTags == b.argumentTags;
}